

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockAtomicCounterBufferIndexContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  Node *pNVar1;
  SharedPtrStateBase *pSVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  Node *pNVar5;
  SharedPtrStateBase *pSVar6;
  TestNode *node;
  ResourceTestCase *pRVar7;
  deInt32 *pdVar8;
  SharedPtr arrayArrayElement;
  SharedPtr arrayElement;
  SharedPtr variable;
  SharedPtr elementvariable;
  ProgramResourceQueryTestTarget queryTarget;
  SharedPtr local_58;
  SharedPtr local_48;
  ProgramResourceQueryTestTarget local_38;
  
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_38,PROGRAMINTERFACE_UNIFORM,8);
  if (parentStructure->m_ptr->m_type == TYPE_INTERFACE_BLOCK) {
    generateVariableCases(context,parentStructure,targetGroup,&local_38,1,false);
  }
  else {
    generateVariableCases(context,parentStructure,targetGroup,&local_38,3,true);
    generateOpaqueTypeCases(context,parentStructure,targetGroup,&local_38,3,true);
    pNVar1 = (Node *)operator_new(0x28);
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar1->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar1->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar2 = parentStructure->m_state;
    (pNVar1->m_enclosingNode).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
    *(undefined4 *)&pNVar1[1]._vptr_Node = 0xffffffff;
    pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar2->strongRefCount = 0;
    pSVar2->weakRefCount = 0;
    pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar2->strongRefCount = 1;
    pSVar2->weakRefCount = 1;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = pNVar1;
    (pNVar3->m_enclosingNode).m_state = pSVar2;
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar1;
    (pNVar5->m_enclosingNode).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 0x54;
    local_58.m_state = (SharedPtrStateBase *)0x0;
    local_58.m_ptr = pNVar5;
    local_58.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_58.m_state)->strongRefCount = 0;
    (local_58.m_state)->weakRefCount = 0;
    (local_58.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    local_58.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_58.m_state)->strongRefCount = 1;
    (local_58.m_state)->weakRefCount = 1;
    pNVar1 = (Node *)operator_new(0x28);
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar1->m_type = TYPE_VARIABLE;
    (pNVar1->m_enclosingNode).m_ptr = pNVar3;
    (pNVar1->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
    *(undefined4 *)&pNVar1[1]._vptr_Node = 0x54;
    local_48.m_state = (SharedPtrStateBase *)0x0;
    local_48.m_ptr = pNVar1;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_48.m_state = pSVar6;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,context->m_testCtx,"array","Arrays");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,node);
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar7,context,&local_58,&local_38,"var_array");
    tcu::TestNode::addChild(node,(TestNode *)pRVar7);
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar7,context,&local_48,&local_38,"var_array_array");
    tcu::TestNode::addChild(node,(TestNode *)pRVar7);
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_48.m_ptr = (Node *)0x0;
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &(local_48.m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (local_48.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_48.m_state = (SharedPtrStateBase *)0x0;
    }
    if (local_58.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &(local_58.m_state)->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_58.m_ptr = (Node *)0x0;
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &(local_58.m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (local_58.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_58.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSVar4->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        (*pSVar4->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &pSVar4->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSVar4 != (SharedPtrStateBase *)0x0)) {
        (*pSVar4->_vptr_SharedPtrStateBase[1])();
      }
    }
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSVar2->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        (*pSVar2->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &pSVar2->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSVar2 != (SharedPtrStateBase *)0x0)) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
    }
  }
  return;
}

Assistant:

static void generateUniformBlockAtomicCounterBufferIndexContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_ATOMIC_COUNTER_BUFFER_INDEX);
	const bool								isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);

	if (!isInterfaceBlock)
	{
		generateVariableCases(context, parentStructure, targetGroup, queryTarget, 3);
		generateOpaqueTypeCases(context, parentStructure, targetGroup, queryTarget, 3);

		// .array
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
			const ResourceDefinition::Node::SharedPtr	arrayArrayElement	(new ResourceDefinition::ArrayElement(arrayElement));
			const ResourceDefinition::Node::SharedPtr	variable			(new ResourceDefinition::Variable(arrayElement, glu::TYPE_UINT_ATOMIC_COUNTER));
			const ResourceDefinition::Node::SharedPtr	elementvariable		(new ResourceDefinition::Variable(arrayArrayElement, glu::TYPE_UINT_ATOMIC_COUNTER));
			tcu::TestCaseGroup* const					blockGroup			= new tcu::TestCaseGroup(context.getTestContext(), "array", "Arrays");

			targetGroup->addChild(blockGroup);

			blockGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "var_array"));
			blockGroup->addChild(new ResourceTestCase(context, elementvariable, queryTarget, "var_array_array"));
		}
	}
	else
		generateVariableCases(context, parentStructure, targetGroup, queryTarget, 1, false);
}